

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

clock_t __thiscall lest::times::times(times *this,tms *__buffer)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  ostream *poVar4;
  undefined1 uStack0000000000000008;
  undefined1 uStack0000000000000009;
  undefined1 uStack000000000000000a;
  undefined1 uStack000000000000000b;
  undefined1 uStack000000000000000c;
  undefined1 uStack000000000000000d;
  undefined1 uStack000000000000000e;
  undefined1 uStack000000000000000f;
  undefined1 uStack0000000000000010;
  undefined1 uStack0000000000000011;
  undefined1 uStack0000000000000012;
  undefined1 uStack0000000000000013;
  undefined4 uStack0000000000000014;
  seed_t in_stack_00000018;
  
  (this->super_action).os = (ostream *)__buffer;
  (this->output).os = (ostream *)__buffer;
  (this->output).opt.help = (bool)uStack0000000000000008;
  (this->output).opt.abort = (bool)uStack0000000000000009;
  (this->output).opt.count = (bool)uStack000000000000000a;
  (this->output).opt.list = (bool)uStack000000000000000b;
  (this->output).opt.tags = (bool)uStack000000000000000c;
  (this->output).opt.time = (bool)uStack000000000000000d;
  (this->output).opt.pass = (bool)uStack000000000000000e;
  (this->output).opt.zen = (bool)uStack000000000000000f;
  (this->output).opt.lexical = (bool)uStack0000000000000010;
  (this->output).opt.random = (bool)uStack0000000000000011;
  (this->output).opt.verbose = (bool)uStack0000000000000012;
  (this->output).opt.version = (bool)uStack0000000000000013;
  (this->output).opt.repeat = uStack0000000000000014;
  (this->output).opt.seed = in_stack_00000018;
  (this->output).testing._M_dataplus._M_p = (pointer)&(this->output).testing.field_2;
  (this->output).testing._M_string_length = 0;
  (this->output).testing.field_2._M_local_buf[0] = '\0';
  (this->output).ctx.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).ctx.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).ctx.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->selected = 0;
  this->failures = 0;
  uVar3 = current_ticks();
  (this->total).start_ticks = uVar3;
  poVar4 = std::operator<<((this->super_action).os,0x20);
  lVar1 = *(long *)poVar4;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 0;
  return (clock_t)poVar4;
}

Assistant:

times( std::ostream & out, options option )
    : action( out ), output( out, option ), selected( 0 ), failures( 0 ), total()
    {
        os << std::setfill(' ') << std::fixed << std::setprecision( lest_FEATURE_TIME_PRECISION );
    }